

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int cd_array_init(parser_info *info,char **attr)

{
  int iVar1;
  coda_type_array *pcVar2;
  char **attr_local;
  parser_info *info_local;
  
  iVar1 = handle_format_attribute_for_type(info,attr);
  if (iVar1 == 0) {
    info->node->free_data = coda_type_release;
    pcVar2 = coda_type_array_new(info->node->format);
    info->node->data = pcVar2;
    if (info->node->data == (void *)0x0) {
      info_local._4_4_ = -1;
    }
    else {
      iVar1 = handle_name_attribute_for_type(info,attr);
      if (iVar1 == 0) {
        register_type_elements(info->node,cd_array_set_type);
        register_sub_element
                  (info->node,element_cd_dimension,optional_integer_constant_or_expression_init,
                   cd_array_add_dimension);
        register_sub_element
                  (info->node,element_cd_description,string_data_init,type_set_description);
        register_sub_element(info->node,element_cd_attribute,cd_attribute_init,type_add_attribute);
        info->node->finalise_element = cd_array_finalise;
        info_local._4_4_ = 0;
      }
      else {
        info_local._4_4_ = -1;
      }
    }
  }
  else {
    info_local._4_4_ = -1;
  }
  return info_local._4_4_;
}

Assistant:

static int cd_array_init(parser_info *info, const char **attr)
{
    if (handle_format_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }

    info->node->free_data = (free_data_handler)coda_type_release;
    info->node->data = coda_type_array_new(info->node->format);
    if (info->node->data == NULL)
    {
        return -1;
    }
    if (handle_name_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }

    register_type_elements(info->node, cd_array_set_type);
    register_sub_element(info->node, element_cd_dimension, optional_integer_constant_or_expression_init,
                         cd_array_add_dimension);
    register_sub_element(info->node, element_cd_description, string_data_init, type_set_description);
    register_sub_element(info->node, element_cd_attribute, cd_attribute_init, type_add_attribute);
    info->node->finalise_element = cd_array_finalise;

    return 0;
}